

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ircode.c
# Opt level: O2

void ircode_free(ircode_t *code)

{
  inst_t **__ptr;
  size_t sVar1;
  uint32_t i;
  ulong uVar2;
  
  sVar1 = code->list->n;
  for (uVar2 = 0; __ptr = code->list->p, (uint)sVar1 != uVar2; uVar2 = uVar2 + 1) {
    free(__ptr[uVar2]);
  }
  free(__ptr);
  free((code->context).p);
  free((code->registers).p);
  free((code->label_true).p);
  free((code->label_false).p);
  free((code->label_check).p);
  free(code->list);
  free(code);
  return;
}

Assistant:

void ircode_free (ircode_t *code) {
    uint32_t count = ircode_count(code);
    for (uint32_t i=0; i<count; ++i) {
        inst_t *inst = marray_get(*code->list, i);
        mem_free(inst);
    }

    marray_destroy(*code->list);
    marray_destroy(code->context);
    marray_destroy(code->registers);
    marray_destroy(code->label_true);
    marray_destroy(code->label_false);
    marray_destroy(code->label_check);
    mem_free(code->list);
    mem_free(code);
}